

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicWait
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,AtomicWait *curr)

{
  Expression **childp;
  Type local_38;
  uintptr_t local_30;
  size_t local_28;
  char *local_20;
  AtomicWait *local_18;
  AtomicWait *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  local_28 = (curr->memory).super_IString.str._M_len;
  local_20 = (curr->memory).super_IString.str._M_str;
  local_18 = curr;
  curr_local = (AtomicWait *)this;
  notePointer(this,&curr->ptr,(Name)(curr->memory).super_IString.str);
  local_30 = (local_18->expectedType).id;
  note(this,&local_18->expected,(Type)local_30);
  childp = &local_18->timeout;
  wasm::Type::Type(&local_38,i64);
  note(this,childp,local_38);
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
    notePointer(&curr->ptr, curr->memory);
    note(&curr->expected, curr->expectedType);
    note(&curr->timeout, Type::i64);
  }